

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void pushstr(BuffFS *buff,char *str,size_t l)

{
  lua_State *L_00;
  StkId pTVar1;
  TString *pTVar2;
  TString *x_;
  TValue *io;
  lua_State *L;
  size_t l_local;
  char *str_local;
  BuffFS *buff_local;
  
  L_00 = buff->L;
  pTVar1 = L_00->top;
  pTVar2 = luaS_newlstr(L_00,str,l);
  if (9 < (pTVar2->tt & 0xf)) {
    __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                  ,0x1a9,"void pushstr(BuffFS *, const char *, size_t)");
  }
  (pTVar1->value_).gc = (GCObject *)pTVar2;
  pTVar1->tt_ = pTVar2->tt | 0x8000;
  if ((pTVar1->tt_ & 0x8000) != 0) {
    if ((pTVar1->tt_ & 0x8000) == 0) {
      __assert_fail("(((io)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                    ,0x1a9,"void pushstr(BuffFS *, const char *, size_t)");
    }
    if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0014aeba:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                    ,0x1a9,"void pushstr(BuffFS *, const char *, size_t)");
    }
    if (L_00 != (lua_State *)0x0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                      ,0x1a9,"void pushstr(BuffFS *, const char *, size_t)");
      }
      if ((((pTVar1->value_).gc)->marked & (L_00->l_G->currentwhite ^ 0x18)) != 0)
      goto LAB_0014aeba;
    }
  }
  L_00->top = L_00->top + 1;
  buff->pushed = buff->pushed + 1;
  if ((1 < buff->pushed) && (L_00->stack_last <= L_00->top + 1)) {
    luaV_concat(L_00,buff->pushed);
    buff->pushed = 1;
  }
  return;
}

Assistant:

static void pushstr (BuffFS *buff, const char *str, size_t l) {
  lua_State *L = buff->L;
  setsvalue2s(L, L->top, luaS_newlstr(L, str, l));
  L->top++;  /* may use one extra slot */
  buff->pushed++;
  if (buff->pushed > 1 && L->top + 1 >= L->stack_last) {
    luaV_concat(L, buff->pushed);  /* join all partial results into one */
    buff->pushed = 1;
  }
}